

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_init_frame_mt(AV1_PRIMARY *ppi,AV1_COMP *cpi)

{
  int local_18;
  int i;
  AV1_COMP *cpi_local;
  AV1_PRIMARY *ppi_local;
  
  (cpi->mt_info).workers = (ppi->p_mt_info).workers;
  (cpi->mt_info).num_workers = (ppi->p_mt_info).num_workers;
  (cpi->mt_info).tile_thr_data = (ppi->p_mt_info).tile_thr_data;
  for (i = 0; i < 0xc; i = i + 1) {
    if ((cpi->mt_info).num_workers < (ppi->p_mt_info).num_mod_workers[i]) {
      local_18 = (cpi->mt_info).num_workers;
    }
    else {
      local_18 = (ppi->p_mt_info).num_mod_workers[i];
    }
    (cpi->mt_info).num_mod_workers[i] = local_18;
  }
  return;
}

Assistant:

void av1_init_frame_mt(AV1_PRIMARY *ppi, AV1_COMP *cpi) {
  cpi->mt_info.workers = ppi->p_mt_info.workers;
  cpi->mt_info.num_workers = ppi->p_mt_info.num_workers;
  cpi->mt_info.tile_thr_data = ppi->p_mt_info.tile_thr_data;
  int i;
  for (i = MOD_FP; i < NUM_MT_MODULES; i++) {
    cpi->mt_info.num_mod_workers[i] =
        AOMMIN(cpi->mt_info.num_workers, ppi->p_mt_info.num_mod_workers[i]);
  }
}